

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O1

void __thiscall
rtosc::AutomationMgr::simpleSlope(AutomationMgr *this,int slot_id,int par,float slope,float offset)

{
  Automation *pAVar1;
  float *pfVar2;
  
  if ((((-1 < slot_id) && (slot_id < this->nslots)) && (-1 < par)) && (par < this->per_slot)) {
    pAVar1 = this->slots[(uint)slot_id].automations;
    pAVar1[(uint)par].map.upoints = 2;
    pfVar2 = pAVar1[(uint)par].map.control_points;
    *pfVar2 = 0.0;
    pfVar2[1] = offset - slope * 0.5;
    pfVar2[2] = 1.0;
    pfVar2[3] = slope * 0.5 + offset;
  }
  return;
}

Assistant:

void AutomationMgr::simpleSlope(int slot_id, int par, float slope, float offset)
{
    if(slot_id >= nslots || slot_id < 0 || par >= per_slot || par < 0)
        return;
    auto &map = slots[slot_id].automations[par].map;
    map.upoints = 2;
    map.control_points[0] = 0;
    map.control_points[1] = -(slope/2)+offset;
    map.control_points[2] =  1;
    map.control_points[3] =  slope/2+offset;

}